

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.h
# Opt level: O3

void __thiscall
cnpy::NpyArray::NpyArray
          (NpyArray *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *_shape,
          size_t _word_size,char _type_code,bool _fortran_order)

{
  pointer puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  vector<char,_std::allocator<char>_> *pvVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  allocator_type local_49;
  vector<char,_std::allocator<char>_> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  (this->data_holder).
  super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->data_holder).
  super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->shape,_shape);
  this->word_size = _word_size;
  this->type_code = _type_code;
  this->fortran_order = _fortran_order;
  this->num_vals = 1;
  puVar1 = (this->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar4 == 0) {
    sVar6 = 1;
  }
  else {
    lVar4 = lVar4 >> 3;
    sVar6 = 1;
    lVar5 = 0;
    do {
      sVar6 = sVar6 * puVar1[lVar5];
      this->num_vals = sVar6;
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  pvVar3 = (vector<char,_std::allocator<char>_> *)operator_new(0x18);
  std::vector<char,_std::allocator<char>_>::vector(pvVar3,sVar6 * _word_size,&local_49);
  local_48 = pvVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::vector<char,std::allocator<char>>*>(a_Stack_40,pvVar3);
  _Var2._M_pi = a_Stack_40[0]._M_pi;
  pvVar3 = local_48;
  local_48 = (vector<char,_std::allocator<char>_> *)0x0;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->data_holder).
            super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->data_holder).
  super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pvVar3;
  (this->data_holder).
  super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
     a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
  }
  return;
}

Assistant:

NpyArray(const std::vector<size_t>& _shape, size_t _word_size, char _type_code, bool _fortran_order) :
            shape(_shape), word_size(_word_size), type_code(_type_code), fortran_order(_fortran_order)
        {
            num_vals = 1;
            for(size_t i = 0;i < shape.size();i++) num_vals *= shape[i];
            data_holder = std::shared_ptr<std::vector<char>>(
                new std::vector<char>(num_vals * word_size));
        }